

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::TryGetArrayAndLength<long>
               (Var arg,ScriptContext *scriptContext,PCWSTR methodName,JavascriptArray **array,
               RecyclableObject **obj,long *length)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *pJVar6;
  uint64 uVar7;
  
  if (array == (JavascriptArray **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6c,"(array != nullptr)","array != nullptr");
    if (!bVar2) goto LAB_00a598ca;
    *puVar5 = 0;
  }
  if (obj == (RecyclableObject **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6d,"(obj != nullptr)","obj != nullptr");
    if (!bVar2) goto LAB_00a598ca;
    *puVar5 = 0;
  }
  if (length == (long *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6e,"(length != nullptr)","length != nullptr");
    if (!bVar2) {
LAB_00a598ca:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pJVar6 = TryVarToNonES5Array(arg);
  *array = pJVar6;
  if ((pJVar6 != (JavascriptArray *)0x0) &&
     (iVar3 = (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x66])(pJVar6), iVar3 == 0)) {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(*array);
    pJVar6 = *array;
    *obj = (RecyclableObject *)pJVar6;
    *length = (ulong)(pJVar6->super_ArrayObject).length;
    return;
  }
  BVar4 = JavascriptConversion::ToObject(arg,scriptContext,obj);
  if (BVar4 != 0) {
    uVar7 = OP_GetLength(*obj,scriptContext);
    *length = uVar7;
    *array = (JavascriptArray *)0x0;
    return;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,methodName);
}

Assistant:

void JavascriptArray::TryGetArrayAndLength(Var arg,
        ScriptContext *scriptContext,
        PCWSTR methodName,
        __out JavascriptArray** array,
        __out RecyclableObject** obj,
        __out T * length)
    {
        Assert(array != nullptr);
        Assert(obj != nullptr);
        Assert(length != nullptr);

        *array = JavascriptArray::TryVarToNonES5Array(arg);
        if (*array && !(*array)->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(*array);
#endif
            *obj = *array;
            *length = (*array)->length;
        }
        else
        {
            if (!JavascriptConversion::ToObject(arg, scriptContext, obj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, methodName);
            }
            *length = OP_GetLength(*obj, scriptContext);
            *array = nullptr;
        }
    }